

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O3

void __thiscall Sampling_SmoothStep_Test::TestBody(Sampling_SmoothStep_Test *this)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float *pfVar15;
  bool bVar16;
  uint uVar17;
  Allocator AVar18;
  byte bVar19;
  char *pcVar20;
  char *in_R9;
  int iVar21;
  uint64_t oldstate_1;
  ulong uVar22;
  uint64_t oldstate;
  undefined1 *puVar23;
  float fVar24;
  float fVar26;
  float fVar27;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  undefined1 auVar36 [16];
  float n2_1;
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  float fVar39;
  float n2;
  undefined1 auVar40 [64];
  float n2_2;
  undefined1 auVar41 [64];
  undefined8 in_XMM11_Qa;
  undefined8 in_XMM11_Qb;
  span<const_float> f;
  AssertionResult gtest_ar_4;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> values;
  Float dp;
  PiecewiseConstant1D distrib;
  AssertHelper local_118;
  AssertHelper local_110;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_100;
  float local_e0;
  undefined4 local_dc;
  undefined1 local_d8 [16];
  float local_bc;
  AssertHelper local_b8;
  Float local_ac;
  undefined1 local_a8 [32];
  polymorphic_allocator<float> local_88;
  float *local_80;
  size_t local_78;
  size_t local_70;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  float fVar25;
  undefined1 auVar28 [16];
  
  local_d8._8_8_ = local_d8._0_8_;
  local_110.data_ = local_110.data_ & 0xffffffff00000000;
  local_100.alloc.memoryResource = (memory_resource *)&DAT_3fb999999999999a;
  testing::internal::CmpHelperLT<float,double>
            ((internal *)local_a8,"std::abs(start - 10)",".1",(float *)&local_110,
             (double *)&local_100);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    std::ostream::_M_insert<double>(10.0);
    if ((float *)local_a8._8_8_ == (float *)0x0) {
      pcVar20 = "";
    }
    else {
      pcVar20 = *(char **)local_a8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
               ,0x25c,pcVar20);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if (local_100.alloc.memoryResource != (memory_resource *)0x0) {
      bVar16 = testing::internal::IsTrue(true);
      if ((bVar16) && (local_100.alloc.memoryResource != (memory_resource *)0x0)) {
        (*(local_100.alloc.memoryResource)->_vptr_memory_resource[1])();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_a8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_110.data_ = local_110.data_ & 0xffffffff00000000;
  local_100.alloc.memoryResource = (memory_resource *)&DAT_3ee4f8b588e368f1;
  testing::internal::CmpHelperLT<float,double>
            ((internal *)local_a8,"std::abs(end - -5)","1e-5",(float *)&local_110,
             (double *)&local_100);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    std::ostream::_M_insert<double>(-5.0);
    if ((float *)local_a8._8_8_ == (float *)0x0) {
      pcVar20 = "";
    }
    else {
      pcVar20 = *(char **)local_a8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
               ,0x25f,pcVar20);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if (local_100.alloc.memoryResource != (memory_resource *)0x0) {
      bVar16 = testing::internal::IsTrue(true);
      if ((bVar16) && (local_100.alloc.memoryResource != (memory_resource *)0x0)) {
        (*(local_100.alloc.memoryResource)->_vptr_memory_resource[1])();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_a8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  auVar41 = ZEXT464(0x358637bd);
  auVar31 = ZEXT816(0) << 0x40;
  auVar40 = ZEXT1664(SUB6416(ZEXT464(0x3f000000),0));
  auVar30 = SUB6416(ZEXT464(0x3f800000),0);
  while( true ) {
    uVar2 = vcmpss_avx512f(auVar40._0_16_,auVar30,1);
    bVar16 = (bool)((byte)uVar2 & 1);
    fVar1 = (auVar30._0_4_ + auVar31._0_4_) * 0.5;
    uVar2 = vcmpss_avx512f(auVar31,auVar40._0_16_,1);
    bVar4 = (bool)((byte)uVar2 & 1);
    fVar24 = (float)((uint)bVar4 * ((uint)bVar16 * auVar40._0_4_ + (uint)!bVar16 * (int)fVar1) +
                    (uint)!bVar4 * (int)fVar1);
    auVar28 = ZEXT416((uint)fVar24);
    fVar35 = fVar24 * fVar24;
    auVar29 = vfmsub231ss_fma(ZEXT416((uint)(fVar35 * fVar35)),ZEXT416((uint)(fVar35 * fVar24)),
                              ZEXT416(0x40000000));
    fVar1 = auVar29._0_4_ + -0.5;
    auVar29._8_4_ = 0x7fffffff;
    auVar29._0_8_ = 0x7fffffff7fffffff;
    auVar29._12_4_ = 0x7fffffff;
    auVar29 = vandps_avx512vl(ZEXT416((uint)fVar1),auVar29);
    bVar16 = fVar1 < 0.0;
    if (auVar29._0_4_ < 1e-06) break;
    fVar25 = (float)((uint)bVar16 * (int)auVar30._0_4_ + (uint)!bVar16 * (int)fVar24);
    auVar30 = ZEXT416((uint)fVar25);
    auVar31._0_4_ = (float)((uint)bVar16 * (int)fVar24 + (uint)!bVar16 * (int)auVar31._0_4_);
    if (fVar25 - auVar31._0_4_ < 1e-06) break;
    uVar2 = vcmpss_avx512f(auVar28,SUB6416(ZEXT464(0x3f800000),0),0xe);
    uVar3 = vcmpss_avx512f(auVar28,ZEXT816(0) << 0x40,1);
    auVar29 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar28,ZEXT416(0x40400000));
    fVar35 = fVar35 * auVar29._0_4_;
    auVar40 = ZEXT464((uint)(fVar24 - fVar1 / (float)((uint)!(bool)((byte)uVar3 & 1) *
                                                     (uint)!(bool)((byte)uVar2 & 1) *
                                                     (int)(fVar35 + fVar35))));
  }
  local_110.data_ = (AssertHelperData *)&DAT_3ee4f8b588e368f1;
  local_d8._0_8_ = (double)fVar24;
  auVar30._8_4_ = 0xffffffff;
  auVar30._0_8_ = 0x7fffffffffffffff;
  auVar30._12_4_ = 0x7fffffff;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = (double)fVar24 + -0.733615;
  auVar31 = vandpd_avx512vl(auVar28,auVar30);
  local_100.alloc.memoryResource = (memory_resource *)vmovlpd_avx(auVar31);
  testing::internal::CmpHelperLT<double,double>
            ((internal *)local_a8,"std::abs(mid - 0.733615)","1e-5",(double *)&local_100,
             (double *)&local_110);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    std::ostream::_M_insert<double>((double)local_d8._0_8_);
    if ((float *)local_a8._8_8_ == (float *)0x0) {
      pcVar20 = "";
    }
    else {
      pcVar20 = *(char **)local_a8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
               ,0x263,pcVar20);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if (local_100.alloc.memoryResource != (memory_resource *)0x0) {
      bVar16 = testing::internal::IsTrue(true);
      if ((bVar16) && (local_100.alloc.memoryResource != (memory_resource *)0x0)) {
        (*(local_100.alloc.memoryResource)->_vptr_memory_resource[1])();
      }
    }
  }
  iVar21 = 0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_a8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  puVar23 = &DAT_5851f42d4c957f2e;
  do {
    uVar17 = (uint)((ulong)puVar23 >> 0x2d) ^ (uint)((ulong)puVar23 >> 0x1b);
    bVar19 = (byte)((ulong)puVar23 >> 0x3b);
    auVar14._8_8_ = in_XMM11_Qb;
    auVar14._0_8_ = in_XMM11_Qa;
    auVar31 = vcvtusi2ss_avx512f(auVar14,uVar17 >> bVar19 | uVar17 << 0x20 - bVar19);
    auVar31 = vminss_avx(ZEXT416((uint)(auVar31._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
    fVar35 = auVar31._0_4_;
    local_d8._0_4_ = fVar35;
    fVar1 = 0.0 - fVar35;
    auVar5._8_4_ = 0x7fffffff;
    auVar5._0_8_ = 0x7fffffff7fffffff;
    auVar5._12_4_ = 0x7fffffff;
    auVar31 = vandps_avx512vl(ZEXT416((uint)fVar1),auVar5);
    auVar30 = SUB6416(ZEXT464(0xc0400000),0);
    if (1e-06 <= auVar31._0_4_) {
      auVar6._8_4_ = 0x7fffffff;
      auVar6._0_8_ = 0x7fffffff7fffffff;
      auVar6._12_4_ = 0x7fffffff;
      auVar31 = vandps_avx512vl(ZEXT416((uint)(1.0 - fVar35)),auVar6);
      auVar30 = SUB6416(ZEXT464(0x40a00000),0);
      if (1e-06 <= auVar31._0_4_) {
        auVar38 = ZEXT464(0x40a00000);
        auVar40 = ZEXT464(0xc0400000);
        fVar24 = (fVar1 * -8.0) / ((1.0 - fVar35) - fVar1) + -3.0;
        while( true ) {
          fVar25 = (auVar38._0_4_ + auVar40._0_4_) * 0.5;
          uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar24),auVar38._0_16_,1);
          bVar16 = (bool)((byte)uVar2 & 1);
          uVar2 = vcmpss_avx512f(auVar40._0_16_,ZEXT416((uint)fVar24),1);
          bVar4 = (bool)((byte)uVar2 & 1);
          fVar24 = (float)((uint)bVar4 * ((uint)bVar16 * (int)fVar24 + (uint)!bVar16 * (int)fVar25)
                          + (uint)!bVar4 * (int)fVar25);
          auVar30 = ZEXT416((uint)fVar24);
          fVar25 = (fVar24 + 3.0) * 0.125;
          fVar39 = 0.0;
          if ((-3.0 <= fVar24) && (fVar24 <= 5.0)) {
            uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar25),ZEXT816(0) << 0x40,1);
            auVar31 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)fVar25));
            fVar39 = (float)((uint)!(bool)((byte)uVar2 & 1) * auVar31._0_4_);
            auVar33._4_12_ = auVar31._4_12_;
            auVar33._0_4_ = fVar39;
            auVar31 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar33,ZEXT416(0x40400000));
            fVar39 = fVar39 * fVar39 * auVar31._0_4_ * 0.25;
          }
          fVar27 = fVar25 * fVar25;
          auVar31 = vfmsub231ss_fma(ZEXT416((uint)(fVar27 * fVar27)),
                                    ZEXT416((uint)(fVar25 * fVar27)),ZEXT416(0x40000000));
          fVar25 = auVar31._0_4_ - fVar35;
          auVar13._8_4_ = 0x7fffffff;
          auVar13._0_8_ = 0x7fffffff7fffffff;
          auVar13._12_4_ = 0x7fffffff;
          auVar31 = vandps_avx512vl(ZEXT416((uint)fVar25),auVar13);
          if (auVar31._0_4_ < 1e-06) break;
          uVar2 = vcmpps_avx512vl(ZEXT416((uint)fVar25),ZEXT816(0) << 0x20,5);
          uVar3 = vcmpps_avx512vl(ZEXT416((uint)fVar1),ZEXT816(0) << 0x20,1);
          bVar19 = (byte)uVar3 ^ (byte)uVar2;
          fVar27 = (float)((uint)(bVar19 & 1) * (int)auVar38._0_4_ +
                          (uint)!(bool)(bVar19 & 1) * (int)fVar24);
          fVar26 = (float)((uint)(bVar19 & 1) * (int)fVar24 +
                          (uint)!(bool)(bVar19 & 1) * (int)auVar40._0_4_);
          auVar40 = ZEXT1664(CONCAT124(auVar40._4_12_,fVar26));
          if (fVar27 - fVar26 < 1e-06) break;
          fVar24 = fVar24 - fVar25 / fVar39;
          auVar38 = ZEXT464((uint)fVar27);
        }
      }
    }
    local_100.alloc.memoryResource = (memory_resource *)&DAT_3ee4f8b588e368f1;
    local_dc = (auVar30._0_4_ + 3.0) * 0.125;
    auVar31 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)local_dc));
    uVar2 = vcmpss_avx512f(ZEXT416((uint)local_dc),ZEXT816(0) << 0x40,1);
    fVar1 = (float)((uint)!(bool)((byte)uVar2 & 1) * auVar31._0_4_);
    auVar32._4_12_ = auVar31._4_12_;
    auVar32._0_4_ = fVar1;
    uVar2 = vcmpss_avx512f(auVar30,ZEXT416(0x40a00000),0xe);
    auVar31 = vfmadd132ss_fma(auVar32,SUB6416(ZEXT464(0x40400000),0),ZEXT416(0xc0000000));
    local_e0 = fVar1 * fVar1 * auVar31._0_4_;
    uVar3 = vcmpss_avx512f(auVar30,ZEXT416(0xc0400000),1);
    local_e0 = local_e0 /
               (float)((uint)!(bool)((byte)uVar3 & 1) *
                      (uint)!(bool)((byte)uVar2 & 1) * (int)(local_e0 * 0.25));
    auVar7._8_4_ = 0x7fffffff;
    auVar7._0_8_ = 0x7fffffff7fffffff;
    auVar7._12_4_ = 0x7fffffff;
    auVar31 = vandps_avx512vl(ZEXT416((uint)(local_e0 + -4.0)),auVar7);
    local_110.data_._0_4_ = auVar31._0_4_;
    testing::internal::CmpHelperLT<float,double>
              ((internal *)local_a8,"std::abs(ratio - 4)","1e-5",(float *)&local_110,
               (double *)&local_100);
    if (local_a8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_100);
      std::ostream::_M_insert<double>((double)local_e0);
      pcVar20 = "";
      if ((float *)local_a8._8_8_ != (float *)0x0) {
        pcVar20 = *(char **)local_a8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_110,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                 ,0x269,pcVar20);
      testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_110);
      if (local_100.alloc.memoryResource != (memory_resource *)0x0) {
        bVar16 = testing::internal::IsTrue(true);
        if ((bVar16) && (local_100.alloc.memoryResource != (memory_resource *)0x0)) {
          (*(local_100.alloc.memoryResource)->_vptr_memory_resource[1])();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_a8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         );
    auVar37._8_4_ = 0x7fffffff;
    auVar37._0_8_ = 0x7fffffff7fffffff;
    auVar37._12_4_ = 0x7fffffff;
    fVar1 = local_dc * local_dc;
    auVar31 = vfmsub231ss_fma(ZEXT416((uint)(fVar1 * fVar1)),ZEXT416((uint)(local_dc * fVar1)),
                              ZEXT416(0x40000000));
    fVar1 = auVar31._0_4_ - auVar31._0_4_;
    auVar36._0_4_ = fVar1 / fVar1;
    auVar36._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar31 = vandps_avx(auVar36,auVar37);
    auVar31 = vminss_avx(auVar31,ZEXT416((uint)local_d8._0_4_));
    fVar1 = (float)local_d8._0_4_ - auVar36._0_4_;
    bVar16 = auVar31._0_4_ < 0.01;
    auVar31 = vandps_avx(ZEXT416((uint)bVar16 * (int)fVar1 +
                                 (uint)!bVar16 *
                                 (int)((fVar1 + fVar1) / ((float)local_d8._0_4_ + auVar36._0_4_))),
                         auVar37);
    local_100.alloc.memoryResource._0_1_ = auVar31._0_4_ <= 0.01;
    local_100.ptr = (float *)0x0;
    if (0.01 < auVar31._0_4_) {
      testing::Message::Message((Message *)&local_110);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_a8,(internal *)&local_100,
                 (AssertionResult *)"checkErr(u, InvertSmoothStepSample(x, -3, 5))","true","false",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                 ,0x273,(char *)CONCAT71(local_a8._1_7_,local_a8[0]));
      testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      if ((undefined1 *)CONCAT71(local_a8._1_7_,local_a8[0]) != local_a8 + 0x10) {
        operator_delete((undefined1 *)CONCAT71(local_a8._1_7_,local_a8[0]),local_a8._16_8_ + 1);
      }
      if (local_110.data_ != (AssertHelperData *)0x0) {
        bVar16 = testing::internal::IsTrue(true);
        if ((bVar16) && (local_110.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_110.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_100.ptr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         );
    iVar21 = iVar21 + 1;
    puVar23 = (undefined1 *)((long)puVar23 * 0x5851f42d4c957f2d + 1);
  } while (iVar21 != 1000);
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<float_(float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp:630:15)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<float_(float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp:630:15)>
             ::_M_manager;
  AVar18.memoryResource = pstd::pmr::new_delete_resource();
  pbrt::Sample1DFunction
            (&local_100,(function<float_(float)> *)&local_58,0x400,0x10000,0.0,1.0,AVar18);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  pfVar15 = local_100.ptr;
  AVar18.memoryResource = pstd::pmr::new_delete_resource();
  f.n = local_100.nStored;
  f.ptr = pfVar15;
  pbrt::PiecewiseConstant1D::PiecewiseConstant1D((PiecewiseConstant1D *)local_a8,f,0.0,1.0,AVar18);
  uVar22 = 0xfffe179e76d83e92;
  iVar21 = 0;
  do {
    local_d8 = ZEXT816(0) << 0x40;
    uVar17 = (uint)(uVar22 >> 0x2d) ^ (uint)(uVar22 >> 0x1b);
    bVar19 = (byte)(uVar22 >> 0x3b);
    auVar31 = vcvtusi2ss_avx512f(auVar41._0_16_,uVar17 >> bVar19 | uVar17 << 0x20 - bVar19);
    auVar31 = vminss_avx(ZEXT416((uint)(auVar31._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
    fVar35 = auVar31._0_4_;
    fVar1 = 0.0 - fVar35;
    auVar8._8_4_ = 0x7fffffff;
    auVar8._0_8_ = 0x7fffffff7fffffff;
    auVar8._12_4_ = 0x7fffffff;
    auVar31 = vandps_avx512vl(ZEXT416((uint)fVar1),auVar8);
    if (1e-06 <= auVar31._0_4_) {
      auVar9._8_4_ = 0x7fffffff;
      auVar9._0_8_ = 0x7fffffff7fffffff;
      auVar9._12_4_ = 0x7fffffff;
      auVar31 = vandps_avx512vl(ZEXT416((uint)(1.0 - fVar35)),auVar9);
      local_d8 = SUB6416(ZEXT464(0x3f800000),0);
      if (1e-06 <= auVar31._0_4_) {
        auVar34._0_12_ = ZEXT812(0);
        auVar34._12_4_ = 0;
        fVar24 = 0.0 - fVar1 / ((1.0 - fVar35) - fVar1);
        auVar40 = ZEXT464(0x3f800000);
        while( true ) {
          fVar25 = (auVar40._0_4_ + auVar34._0_4_) * 0.5;
          uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar24),auVar40._0_16_,1);
          bVar16 = (bool)((byte)uVar2 & 1);
          uVar2 = vcmpss_avx512f(auVar34,ZEXT416((uint)fVar24),1);
          bVar4 = (bool)((byte)uVar2 & 1);
          fVar24 = (float)((uint)bVar4 * ((uint)bVar16 * (int)fVar24 + (uint)!bVar16 * (int)fVar25)
                          + (uint)!bVar4 * (int)fVar25);
          local_d8 = ZEXT416((uint)fVar24);
          fVar25 = fVar24 * fVar24;
          auVar31 = vfmsub231ss_fma(ZEXT416((uint)(fVar25 * fVar25)),
                                    ZEXT416((uint)(fVar24 * fVar25)),ZEXT416(0x40000000));
          fVar39 = auVar31._0_4_ - fVar35;
          auVar12._8_4_ = 0x7fffffff;
          auVar12._0_8_ = 0x7fffffff7fffffff;
          auVar12._12_4_ = 0x7fffffff;
          auVar31 = vandps_avx512vl(ZEXT416((uint)fVar39),auVar12);
          if (auVar31._0_4_ < 1e-06) break;
          auVar31 = ZEXT816(0) << 0x40;
          uVar2 = vcmpps_avx512vl(ZEXT416((uint)fVar39),auVar31,5);
          uVar3 = vcmpps_avx512vl(ZEXT416((uint)fVar1),auVar31,1);
          bVar19 = (byte)uVar3 ^ (byte)uVar2;
          fVar27 = (float)((uint)(bVar19 & 1) * (int)auVar40._0_4_ +
                          (uint)!(bool)(bVar19 & 1) * (int)fVar24);
          auVar34._0_4_ =
               (float)((uint)(bVar19 & 1) * (int)fVar24 +
                      (uint)!(bool)(bVar19 & 1) * (int)auVar34._0_4_);
          if (fVar27 - auVar34._0_4_ < 1e-06) break;
          uVar2 = vcmpss_avx512f(local_d8,ZEXT416(0x3f800000),0xe);
          uVar3 = vcmpss_avx512f(local_d8,auVar31,1);
          auVar31 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_d8,ZEXT416(0x40400000));
          fVar25 = fVar25 * auVar31._0_4_;
          fVar24 = fVar24 - fVar39 / (float)((uint)!(bool)((byte)uVar3 & 1) *
                                            (uint)!(bool)((byte)uVar2 & 1) * (int)(fVar25 + fVar25))
          ;
          auVar40 = ZEXT464((uint)fVar27);
        }
      }
    }
    uVar2 = vcmpss_avx512f(local_d8,ZEXT416(0x3f800000),0xe);
    auVar31 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_d8,ZEXT416(0x40400000));
    local_dc = (float)(CONCAT22(local_dc._2_2_,(short)uVar2) & 0xffff0001);
    local_e0 = auVar31._0_4_;
    local_ac = pbrt::PiecewiseConstant1D::Sample
                         ((PiecewiseConstant1D *)local_a8,fVar35,&local_bc,(int *)0x0);
    local_118.data_ = (AssertHelperData *)&DAT_3f689374bc6a7efa;
    auVar10._8_4_ = 0x7fffffff;
    auVar10._0_8_ = 0x7fffffff7fffffff;
    auVar10._12_4_ = 0x7fffffff;
    auVar31 = vandps_avx512vl(ZEXT416((uint)((float)local_d8._0_4_ - local_ac)),auVar10);
    local_b8.data_._0_4_ = auVar31._0_4_;
    testing::internal::CmpHelperLT<float,double>
              ((internal *)&local_110,"std::abs(cx - dx)","3e-3",(float *)&local_b8,
               (double *)&local_118);
    if (local_110.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_118);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(local_118.data_)->line,"Closed form = ",0xe);
      std::ostream::_M_insert<double>((double)(float)local_d8._0_4_);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(local_118.data_)->line,", distrib = ",0xc);
      std::ostream::_M_insert<double>((double)local_ac);
      pcVar20 = "";
      if (local_108.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        pcVar20 = ((local_108.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                 ,0x27f,pcVar20);
      testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_118);
      testing::internal::AssertHelper::~AssertHelper(&local_b8);
      if (local_118.data_ != (AssertHelperData *)0x0) {
        bVar16 = testing::internal::IsTrue(true);
        if ((bVar16) && (local_118.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_118.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_108,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_118.data_ = (AssertHelperData *)&DAT_3f689374bc6a7efa;
    fVar1 = local_d8._0_4_ * local_d8._0_4_ * local_e0;
    uVar2 = vcmpss_avx512f(local_d8,ZEXT816(0),1);
    fVar1 = (float)((uint)!(bool)((byte)uVar2 & 1) *
                   (uint)!(bool)(SUB41(local_dc,0) & 1) * (int)(fVar1 + fVar1));
    local_d8 = ZEXT416((uint)fVar1);
    auVar11._8_4_ = 0x7fffffff;
    auVar11._0_8_ = 0x7fffffff7fffffff;
    auVar11._12_4_ = 0x7fffffff;
    auVar31 = vandps_avx512vl(ZEXT416((uint)(fVar1 - local_bc)),auVar11);
    local_b8.data_._0_4_ = auVar31._0_4_;
    testing::internal::CmpHelperLT<float,double>
              ((internal *)&local_110,"std::abs(cp - dp)","3e-3",(float *)&local_b8,
               (double *)&local_118);
    if (local_110.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_118);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(local_118.data_)->line,"Closed form PDF = ",0x12);
      std::ostream::_M_insert<double>((double)(float)local_d8._0_4_);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(local_118.data_)->line,", distrib PDF = ",0x10);
      std::ostream::_M_insert<double>((double)local_bc);
      pcVar20 = "";
      if (local_108.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        pcVar20 = ((local_108.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                 ,0x281,pcVar20);
      testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_118);
      testing::internal::AssertHelper::~AssertHelper(&local_b8);
      if (local_118.data_ != (AssertHelperData *)0x0) {
        bVar16 = testing::internal::IsTrue(true);
        if ((bVar16) && (local_118.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_118.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_108,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    iVar21 = iVar21 + 1;
    uVar22 = uVar22 * 0x5851f42d4c957f2d + 0x1e71f;
    if (iVar21 == 100) {
      local_70 = 0;
      (*(local_88.memoryResource)->_vptr_memory_resource[3])
                (local_88.memoryResource,local_80,local_78 << 2,4);
      local_a8._24_8_ = 0;
      (**(code **)(*(long *)CONCAT71(local_a8._1_7_,local_a8[0]) + 0x18))
                ((long *)CONCAT71(local_a8._1_7_,local_a8[0]),local_a8._8_8_,local_a8._16_8_ << 2,4)
      ;
      local_100.nStored = 0;
      (*(local_100.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_100.alloc.memoryResource,local_100.ptr,local_100.nAlloc << 2,4);
      return;
    }
  } while( true );
}

Assistant:

TEST(Sampling, SmoothStep) {
    Float start = SampleSmoothStep(0, 10, 20);
    // Fairly high slop since lots of values close to the start are close
    // to zero.
    EXPECT_LT(std::abs(start - 10), .1) << start;

    Float end = SampleSmoothStep(1, -10, -5);
    EXPECT_LT(std::abs(end - -5), 1e-5) << end;

    Float mid = SampleSmoothStep(0.5, 0, 1);
    // Solved this numericalla in Mathematica.
    EXPECT_LT(std::abs(mid - 0.733615), 1e-5) << mid;

    for (Float u : Uniform1D(1000)) {
        Float x = SampleSmoothStep(u, -3, 5);
        Float ratio = SmoothStep(x, -3, 5) / SmoothStepPDF(x, -3, 5);
        // SmoothStep over [-3,5] integrates to 4.
        EXPECT_LT(std::abs(ratio - 4), 1e-5) << ratio;

        auto checkErr = [](Float a, Float b) {
            Float err;
            if (std::min(std::abs(a), std::abs(b)) < 1e-2)
                err = std::abs(a - b);
            else
                err = std::abs(2 * (a - b) / (a + b));
            return err > 1e-2;
        };
        EXPECT_FALSE(checkErr(u, InvertSmoothStepSample(x, -3, 5)));
    }

    auto ss = [](Float v) { return SmoothStep(v, 0, 1); };
    auto values = Sample1DFunction(ss, 1024, 64 * 1024, 0.f, 1.f);
    PiecewiseConstant1D distrib(values);
    for (Float u : Uniform1D(100, 62351)) {
        Float cx = SampleSmoothStep(u, 0, 1);
        Float cp = SmoothStepPDF(cx, 0, 1);

        Float dp;
        Float dx = distrib.Sample(u, &dp);
        EXPECT_LT(std::abs(cx - dx), 3e-3)
            << "Closed form = " << cx << ", distrib = " << dx;
        EXPECT_LT(std::abs(cp - dp), 3e-3)
            << "Closed form PDF = " << cp << ", distrib PDF = " << dp;
    }
}